

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog.cpp
# Opt level: O2

int __thiscall Dialog::PacketLength(Dialog *this)

{
  _Elt_pointer pbVar1;
  size_type sVar2;
  _Base_ptr p_Var3;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  _Elt_pointer pbVar4;
  pointer pcVar5;
  _Elt_pointer pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> page;
  _Map_pointer local_60;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  size_type local_48;
  
  sVar2 = std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->pages);
  pcVar5 = (pointer)((this->links)._M_t._M_impl.super__Rb_tree_header._M_node_count * 5 + sVar2 * 3)
  ;
  pbVar6 = (this->pages).
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pbVar4 = (this->pages).
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  local_60 = (this->pages).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node;
  pbVar1 = (this->pages).
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  while (pbVar6 != pbVar1) {
    std::__cxx11::string::string((string *)local_58,(string *)pbVar6);
    pcVar5 = pcVar5 + local_50._M_p;
    std::__cxx11::string::~string((string *)local_58);
    pbVar6 = pbVar6 + 1;
    if (pbVar6 == pbVar4) {
      pbVar6 = local_60[1];
      local_60 = local_60 + 1;
      pbVar4 = pbVar6 + 0x10;
    }
  }
  for (p_Var3 = (this->links)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->links)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_58,
           (pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(p_Var3 + 1));
    pcVar5 = pcVar5 + local_48;
    std::__cxx11::string::~string((string *)&local_50);
  }
  return (int)pcVar5;
}

Assistant:

int Dialog::PacketLength() const
{
	std::size_t size = this->pages.size() * 3;
	size += this->links.size() * 5;

	UTIL_FOREACH(this->pages, page)
	{
		size += page.length();
	}

	UTIL_FOREACH(this->links, link)
	{
		size += link.second.length();
	}

	return size;
}